

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2configuration.cpp
# Opt level: O2

bool __thiscall QHttp2Configuration::setMaxFrameSize(QHttp2Configuration *this,uint size)

{
  QHttp2ConfigurationPrivate *pQVar1;
  QLoggingCategory *pQVar2;
  long in_FS_OFFSET;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (size - 0x4000 < 0xffc000) {
    pQVar1 = QSharedDataPointer<QHttp2ConfigurationPrivate>::operator->(&this->d);
    pQVar1->maxFrameSize = size;
  }
  else {
    pQVar2 = QtPrivateLogging::QT_HTTP2();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::warning();
      QDebug::operator<<(&local_20,"Maximum frame size to advertise is invalid");
      QDebug::~QDebug(&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return size - 0x4000 < 0xffc000;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Configuration::setMaxFrameSize(unsigned size)
{
    if (size < Http2::minPayloadLimit || size > Http2::maxPayloadSize) {
        qCWarning(QT_HTTP2) << "Maximum frame size to advertise is invalid";
        return false;
    }

    d->maxFrameSize = size;
    return true;
}